

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_cms_status_project.cc
# Opt level: O0

int __thiscall
aliyun::Cms::StatusProject
          (Cms *this,CmsStatusProjectRequestType *req,CmsStatusProjectResponseType *response,
          CmsErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  AliRpcRequest *pAVar4;
  ulong uVar5;
  Value *pVVar6;
  bool local_42a;
  allocator<char> local_429;
  string local_428;
  byte local_402;
  allocator<char> local_401;
  string local_400;
  byte local_3da;
  allocator<char> local_3d9;
  string local_3d8;
  byte local_3b2;
  allocator<char> local_3b1;
  string local_3b0;
  allocator<char> local_389;
  string local_388;
  allocator<char> local_361;
  string local_360;
  string local_340;
  allocator<char> local_319;
  string local_318;
  allocator<char> local_2f1;
  string local_2f0;
  allocator<char> local_2c9;
  string local_2c8;
  undefined1 local_2a8 [8];
  Reader reader;
  Value val;
  string local_178;
  undefined1 local_151;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  AliRpcRequest *local_98;
  AliRpcRequest *req_rpc;
  allocator<char> local_79;
  undefined1 local_78 [8];
  string secheme;
  int local_50;
  bool parse_success;
  int ret;
  int status_code;
  string str_response;
  CmsErrorInfo *error_info_local;
  CmsStatusProjectResponseType *response_local;
  CmsStatusProjectRequestType *req_local;
  Cms *this_local;
  
  str_response.field_2._8_8_ = error_info;
  std::__cxx11::string::string((string *)&ret);
  secheme.field_2._M_local_buf[0xf] = '\0';
  pcVar3 = "http";
  if ((this->use_tls_ & 1U) != 0) {
    pcVar3 = "https";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_78,pcVar3,&local_79);
  std::allocator<char>::~allocator(&local_79);
  pAVar4 = (AliRpcRequest *)operator_new(0x2c8);
  local_151 = 1;
  pcVar3 = this->version_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,pcVar3,&local_b9);
  pcVar3 = this->appid_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,pcVar3,&local_e1);
  pcVar3 = this->secret_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,pcVar3,&local_109);
  std::operator+(&local_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,"://"
                );
  std::operator+(&local_130,&local_150,this->host_);
  AliRpcRequest::AliRpcRequest(pAVar4,&local_b8,&local_e0,&local_108,&local_130);
  local_151 = 0;
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  local_98 = pAVar4;
  if ((((this->use_tls_ & 1U) == 0) && (this->proxy_host_ != (char *)0x0)) &&
     (*this->proxy_host_ != '\0')) {
    pcVar3 = this->proxy_host_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,pcVar3,(allocator<char> *)((long)&val.comments_ + 7));
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)pAVar4,&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator((allocator<char> *)((long)&val.comments_ + 7));
  }
  Json::Value::Value((Value *)&reader.features_,nullValue);
  Json::Reader::Reader((Reader *)local_2a8);
  pAVar4 = local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"Action",&local_2c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f0,"StatusProject",&local_2f1);
  AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_2c8,&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  uVar5 = std::__cxx11::string::empty();
  pAVar4 = local_98;
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_318,"ProjectName",&local_319);
    std::__cxx11::string::string((string *)&local_340,(string *)req);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_318,&local_340);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_318);
    std::allocator<char>::~allocator(&local_319);
  }
  pAVar4 = local_98;
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"RegionId",&local_361);
    pcVar3 = this->region_id_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,pcVar3,&local_389);
    AliHttpRequest::AddRequestQuery(&pAVar4->super_AliHttpRequest,&local_360,&local_388);
    std::__cxx11::string::~string((string *)&local_388);
    std::allocator<char>::~allocator(&local_389);
    std::__cxx11::string::~string((string *)&local_360);
    std::allocator<char>::~allocator(&local_361);
  }
  iVar2 = (**(local_98->super_AliHttpRequest)._vptr_AliHttpRequest)();
  if (iVar2 == 0) {
    local_50 = AliHttpRequest::WaitResponseHeaderComplete(&local_98->super_AliHttpRequest);
    AliHttpRequest::ReadResponseBody(&local_98->super_AliHttpRequest,(string *)&ret);
    if ((0 < local_50) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
      secheme.field_2._M_local_buf[0xf] =
           Json::Reader::parse((Reader *)local_2a8,(string *)&ret,(Value *)&reader.features_,true);
    }
    if ((secheme.field_2._M_local_buf[0xf] & 1U) == 0) {
      if (str_response.field_2._8_8_ != 0) {
        std::__cxx11::string::operator=
                  ((string *)(str_response.field_2._8_8_ + 0x20),"parse response failed");
      }
      local_50 = -1;
    }
    else {
      if (((local_50 != 200) && (str_response.field_2._8_8_ != 0)) &&
         ((secheme.field_2._M_local_buf[0xf] & 1U) != 0)) {
        local_3b2 = 0;
        bVar1 = Json::Value::isMember((Value *)&reader.features_,"RequestId");
        if (bVar1) {
          pVVar6 = Json::Value::operator[]((Value *)&reader.features_,"RequestId");
          Json::Value::asString_abi_cxx11_(&local_3b0,pVVar6);
        }
        else {
          std::allocator<char>::allocator();
          local_3b2 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3b0,anon_var_dwarf_16d4a9 + 9,&local_3b1);
        }
        std::__cxx11::string::operator=((string *)str_response.field_2._8_8_,(string *)&local_3b0);
        std::__cxx11::string::~string((string *)&local_3b0);
        if ((local_3b2 & 1) != 0) {
          std::allocator<char>::~allocator(&local_3b1);
        }
        local_3da = 0;
        bVar1 = Json::Value::isMember((Value *)&reader.features_,"Code");
        if (bVar1) {
          pVVar6 = Json::Value::operator[]((Value *)&reader.features_,"Code");
          Json::Value::asString_abi_cxx11_(&local_3d8,pVVar6);
        }
        else {
          std::allocator<char>::allocator();
          local_3da = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3d8,anon_var_dwarf_16d4a9 + 9,&local_3d9);
        }
        std::__cxx11::string::operator=
                  ((string *)(str_response.field_2._8_8_ + 0x20),(string *)&local_3d8);
        std::__cxx11::string::~string((string *)&local_3d8);
        if ((local_3da & 1) != 0) {
          std::allocator<char>::~allocator(&local_3d9);
        }
        local_402 = 0;
        bVar1 = Json::Value::isMember((Value *)&reader.features_,"HostId");
        if (bVar1) {
          pVVar6 = Json::Value::operator[]((Value *)&reader.features_,"HostId");
          Json::Value::asString_abi_cxx11_(&local_400,pVVar6);
        }
        else {
          std::allocator<char>::allocator();
          local_402 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_400,anon_var_dwarf_16d4a9 + 9,&local_401);
        }
        std::__cxx11::string::operator=
                  ((string *)(str_response.field_2._8_8_ + 0x60),(string *)&local_400);
        std::__cxx11::string::~string((string *)&local_400);
        if ((local_402 & 1) != 0) {
          std::allocator<char>::~allocator(&local_401);
        }
        local_42a = Json::Value::isMember((Value *)&reader.features_,"Message");
        if (local_42a) {
          pVVar6 = Json::Value::operator[]((Value *)&reader.features_,"Message");
          Json::Value::asString_abi_cxx11_(&local_428,pVVar6);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_428,anon_var_dwarf_16d4a9 + 9,&local_429);
        }
        local_42a = !local_42a;
        std::__cxx11::string::operator=
                  ((string *)(str_response.field_2._8_8_ + 0x40),(string *)&local_428);
        std::__cxx11::string::~string((string *)&local_428);
        if (local_42a) {
          std::allocator<char>::~allocator(&local_429);
        }
      }
      if ((local_50 == 200) && (response != (CmsStatusProjectResponseType *)0x0)) {
        anon_unknown.dwarf_eff0d::Json2Type((Value *)&reader.features_,response);
      }
    }
  }
  else {
    if (str_response.field_2._8_8_ != 0) {
      std::__cxx11::string::operator=
                ((string *)(str_response.field_2._8_8_ + 0x20),"connect to host failed");
    }
    local_50 = -1;
  }
  pAVar4 = local_98;
  if (local_98 != (AliRpcRequest *)0x0) {
    AliRpcRequest::~AliRpcRequest(local_98);
    operator_delete(pAVar4,0x2c8);
  }
  Json::Reader::~Reader((Reader *)local_2a8);
  Json::Value::~Value((Value *)&reader.features_);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)&ret);
  return local_50;
}

Assistant:

int Cms::StatusProject(const CmsStatusProjectRequestType& req,
                      CmsStatusProjectResponseType* response,
                       CmsErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","StatusProject");
  if(!req.project_name.empty()) {
    req_rpc->AddRequestQuery("ProjectName", req.project_name);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}